

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  ImDrawList *pIVar6;
  ImGuiTabItem *tab_00;
  char *in_RSI;
  ImGuiTabBar *in_RDI;
  ImGuiTabItem *tab_1;
  int tab_n_1;
  ImDrawList *draw_list;
  bool open;
  ImGuiTabItem *tab;
  int tab_n;
  bool is_active;
  char *buf_end;
  char *p;
  char buf [256];
  float in_stack_fffffffffffffe30;
  float in_stack_fffffffffffffe34;
  char *local_1c8;
  uint in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined2 in_stack_fffffffffffffe4c;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 in_stack_fffffffffffffe4f;
  char cVar7;
  undefined8 in_stack_fffffffffffffe50;
  ImGuiCol idx;
  char *local_1a0;
  char *in_stack_fffffffffffffe78;
  int iVar8;
  ImVec2 *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  uint uVar9;
  uint uVar10;
  ImVec2 local_168;
  ImVec2 local_160;
  ImVec2 local_158;
  float in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  undefined7 in_stack_fffffffffffffec0;
  ImGuiTabItem *in_stack_fffffffffffffec8;
  int i;
  undefined4 in_stack_fffffffffffffed4;
  char *local_120;
  char local_118 [8];
  undefined1 auStack_18 [8];
  char *local_10;
  ImGuiTabBar *local_8;
  
  iVar8 = in_RDI->PrevFrameVisible;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar3 = GetFrameCount();
  bVar2 = iVar3 + -2 <= iVar8;
  uVar9 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffed4);
  pcVar5 = " *Inactive*";
  if (bVar2) {
    pcVar5 = "";
  }
  iVar3 = ImFormatString(local_118,(size_t)(auStack_18 + -(long)local_118),"%s 0x%08X (%d tabs)%s",
                         local_10,(ulong)local_8->ID,(ulong)(uint)(local_8->Tabs).Size,pcVar5);
  local_120 = local_118 + iVar3;
  iVar3 = ImFormatString(local_120,(size_t)(auStack_18 + -(long)local_120),"  { ");
  local_120 = local_120 + iVar3;
  iVar3 = 0;
  while( true ) {
    i = iVar3;
    iVar4 = ImMin<int>((local_8->Tabs).Size,3);
    idx = (ImGuiCol)((ulong)in_stack_fffffffffffffe50 >> 0x20);
    if (iVar4 <= iVar3) break;
    in_stack_fffffffffffffec8 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,i);
    in_stack_fffffffffffffe78 = "";
    if (0 < i) {
      in_stack_fffffffffffffe78 = ", ";
    }
    if (in_stack_fffffffffffffec8->NameOffset == -1) {
      local_1a0 = "???";
    }
    else {
      local_1a0 = ImGuiTabBar::GetTabName(local_8,in_stack_fffffffffffffec8);
    }
    iVar3 = ImFormatString(local_120,(size_t)(auStack_18 + -(long)local_120),"%s\'%s\'",
                           in_stack_fffffffffffffe78,local_1a0);
    local_120 = local_120 + iVar3;
    iVar3 = i + 1;
  }
  pcVar5 = " } ";
  if (3 < (local_8->Tabs).Size) {
    pcVar5 = " ... }";
  }
  ImFormatString(local_120,(size_t)(auStack_18 + -(long)local_120),pcVar5);
  if ((uVar9 & 0x1000000) == 0) {
    GetStyleColorVec4(1);
    PushStyleColor(idx,(ImVec4 *)
                       CONCAT17(in_stack_fffffffffffffe4f,
                                CONCAT16(in_stack_fffffffffffffe4e,
                                         CONCAT24(in_stack_fffffffffffffe4c,
                                                  in_stack_fffffffffffffe48))));
  }
  bVar1 = TreeNode(local_10,"%s",local_118);
  if ((uVar9 & 0x1000000) == 0) {
    PopStyleColor((int)in_stack_fffffffffffffe34);
  }
  if (((uVar9 & 0x1000000) != 0) && (bVar2 = IsItemHovered(in_stack_fffffffffffffe40), bVar2)) {
    pIVar6 = GetForegroundDrawList();
    ImDrawList::AddRect((ImDrawList *)CONCAT44(uVar9,i),(ImVec2 *)in_stack_fffffffffffffec8,
                        (ImVec2 *)CONCAT17(bVar1,in_stack_fffffffffffffec0),
                        (ImU32)((ulong)pIVar6 >> 0x20),SUB84(pIVar6,0),
                        (ImDrawFlags)in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
    ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffeb0,local_8->ScrollingRectMinX,
                   (local_8->BarRect).Min.y);
    ImVec2::ImVec2(&local_158,local_8->ScrollingRectMinX,(local_8->BarRect).Max.y);
    ImDrawList::AddLine((ImDrawList *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        in_stack_fffffffffffffe88,(ImVec2 *)CONCAT44(iVar8,iVar3),
                        (ImU32)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                        SUB84(in_stack_fffffffffffffe78,0));
    ImVec2::ImVec2(&local_160,local_8->ScrollingRectMaxX,(local_8->BarRect).Min.y);
    ImVec2::ImVec2(&local_168,local_8->ScrollingRectMaxX,(local_8->BarRect).Max.y);
    ImDrawList::AddLine((ImDrawList *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        in_stack_fffffffffffffe88,(ImVec2 *)CONCAT44(iVar8,iVar3),
                        (ImU32)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                        SUB84(in_stack_fffffffffffffe78,0));
  }
  if ((bVar1 & 1) != 0) {
    uVar9 = 0;
    while ((int)uVar9 < (local_8->Tabs).Size) {
      tab_00 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,uVar9);
      PushID((void *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      bVar2 = SmallButton((char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      if (bVar2) {
        TabBarQueueReorder(local_8,tab_00,-1);
      }
      SameLine(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
      bVar2 = SmallButton((char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      if (bVar2) {
        TabBarQueueReorder(local_8,tab_00,1);
      }
      SameLine(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
      cVar7 = '*';
      if (tab_00->ID != local_8->SelectedTabId) {
        cVar7 = ' ';
      }
      in_stack_fffffffffffffe40 = (uint)cVar7;
      in_stack_fffffffffffffe44 = tab_00->ID;
      uVar10 = uVar9;
      if (tab_00->NameOffset == -1) {
        local_1c8 = "???";
      }
      else {
        local_1c8 = ImGuiTabBar::GetTabName(local_8,tab_00);
      }
      Text((char *)(double)tab_00->Offset,(double)tab_00->Width,(double)tab_00->ContentWidth,
           "%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",(ulong)uVar9,
           (ulong)in_stack_fffffffffffffe40,(ulong)in_stack_fffffffffffffe44,local_1c8);
      PopID();
      uVar9 = uVar10 + 1;
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    p += ImFormatString(p, buf_end - p, "  { ");
    for (int tab_n = 0; tab_n < ImMin(tab_bar->Tabs.Size, 3); tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        p += ImFormatString(p, buf_end - p, "%s'%s'",
            tab_n > 0 ? ", " : "", (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???");
    }
    p += ImFormatString(p, buf_end - p, (tab_bar->Tabs.Size > 3) ? " ... }" : " } ");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(label, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}